

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  u8 *puVar1;
  Table *pTVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Expr *pEVar6;
  size_t sVar7;
  ExprList_item *pEVar8;
  u8 uVar9;
  uint uVar10;
  RenameToken *pRVar11;
  Expr *pEVar12;
  long lVar13;
  Column *pCVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  Column *local_60;
  
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    if ((pTVar2->tabFlags & 4) == 0) {
      uVar3 = pTVar2->tabFlags | 4;
      pTVar2->tabFlags = uVar3;
      if (pList == (ExprList *)0x0) {
        uVar16 = (long)pTVar2->nCol - 1;
        local_60 = pTVar2->aCol + uVar16;
        puVar1 = &pTVar2->aCol[uVar16].colFlags;
        *puVar1 = *puVar1 | 1;
        bVar18 = true;
LAB_00170d4f:
        if ((bVar18) && (local_60 != (Column *)0x0)) {
          if ((local_60->colFlags & 4) == 0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = local_60->zName;
            sVar7 = strlen(pcVar15);
            pcVar15 = pcVar15 + sVar7 + 1;
          }
          iVar5 = sqlite3StrICmp(pcVar15,"INTEGER");
          if ((sortOrder != 1) && (iVar5 == 0)) {
            if ((pList != (ExprList *)0x0) && (1 < pParse->eParseMode)) {
              pEVar6 = pList->a[0].pExpr;
              while (pEVar6 != (Expr *)0x0) {
                if ((pEVar6->flags >> 0xc & 1) == 0) goto LAB_00170e72;
                if ((pEVar6->flags >> 0x12 & 1) == 0) {
                  pEVar8 = (ExprList_item *)&pEVar6->pLeft;
                }
                else {
                  pEVar8 = ((pEVar6->x).pList)->a;
                }
                pEVar6 = pEVar8->pExpr;
              }
              pEVar6 = (Expr *)0x0;
LAB_00170e72:
              pRVar11 = pParse->pRename;
              if (pRVar11 != (RenameToken *)0x0) {
                do {
                  if ((Expr *)pRVar11->p == pEVar6) {
                    pRVar11->p = &pTVar2->iPKey;
                    break;
                  }
                  pRVar11 = pRVar11->pNext;
                } while (pRVar11 != (RenameToken *)0x0);
              }
            }
            pTVar2->iPKey = (i16)uVar16;
            pTVar2->keyConf = (u8)onError;
            pTVar2->tabFlags = uVar3 | autoInc << 3;
            if (pList == (ExprList *)0x0) {
              return;
            }
            pParse->iPkSortOrder = pList->a[0].sortOrder;
            goto LAB_00170e11;
          }
        }
      }
      else {
        iVar5 = pList->nExpr;
        if (0 < (long)iVar5) {
          uVar16 = 0xffffffff;
          lVar13 = 0;
          local_60 = (Column *)0x0;
          do {
            pEVar6 = pList->a[lVar13].pExpr;
            while (pEVar6 != (Expr *)0x0) {
              if ((pEVar6->flags >> 0xc & 1) == 0) goto LAB_00170c72;
              if ((pEVar6->flags >> 0x12 & 1) == 0) {
                pEVar8 = (ExprList_item *)&pEVar6->pLeft;
              }
              else {
                pEVar8 = ((pEVar6->x).pList)->a;
              }
              pEVar6 = pEVar8->pExpr;
            }
            pEVar6 = (Expr *)0x0;
LAB_00170c72:
            uVar9 = pEVar6->op;
            pEVar12 = pEVar6;
            if (uVar9 == 'n') {
LAB_00170c8b:
              pEVar12->op = ';';
              uVar9 = pEVar6->op;
LAB_00170c90:
              if (uVar9 == ';') {
                uVar10 = (uint)pTVar2->nCol;
                uVar16 = (ulong)uVar10;
                if ((int)uVar10 < 1) {
                  uVar16 = 0;
                }
                else {
                  pcVar15 = (pEVar6->u).zToken;
                  pCVar14 = pTVar2->aCol;
                  uVar17 = 0;
                  do {
                    iVar4 = sqlite3StrICmp(pcVar15,pCVar14->zName);
                    if (iVar4 == 0) {
                      pCVar14->colFlags = pCVar14->colFlags | 1;
                      uVar16 = uVar17;
                      local_60 = pCVar14;
                      break;
                    }
                    uVar17 = uVar17 + 1;
                    pCVar14 = pCVar14 + 1;
                  } while (uVar10 != uVar17);
                }
              }
            }
            else {
              if (uVar9 != 'j') goto LAB_00170c90;
              pEVar12 = pEVar6->pLeft;
              if (pEVar12->op == 'n') goto LAB_00170c8b;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != iVar5);
          bVar18 = iVar5 == 1;
          goto LAB_00170d4f;
        }
      }
      if (autoInc == 0) {
        sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                           (Token *)0x0,(Expr *)0x0,sortOrder,0,'\x02');
        return;
      }
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
    }
    else {
      sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar2->zName);
    }
  }
  if (pList == (ExprList *)0x0) {
    return;
  }
LAB_00170e11:
  exprListDeleteNN(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    pCol->colFlags |= COLFLAG_PRIMKEY;
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zName)==0 ){
            pCol = &pTab->aCol[iCol];
            pCol->colFlags |= COLFLAG_PRIMKEY;
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && sqlite3StrICmp(sqlite3ColumnType(pCol,""), "INTEGER")==0
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].sortOrder;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}